

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leccalc.cpp
# Opt level: O0

void leccalc::outputaggreports
               (aggreports *agg,set<int,_std::less<int>,_std::allocator<int>_> *summaryids,
               vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
               *out_loss,int samplesize,vector<int,_std::allocator<int>_> *fileIDs_occ,
               vector<int,_std::allocator<int>_> *fileIDs_agg,bool hasEPT)

{
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  set<int,_std::less<int>,_std::allocator<int>_> *psVar1;
  allocator<int> local_109;
  int local_108 [2];
  iterator local_100;
  size_type local_f8;
  vector<int,_std::allocator<int>_> local_f0;
  code *local_d8;
  undefined8 local_d0;
  allocator<int> local_b1;
  int local_b0 [2];
  iterator local_a8;
  size_type local_a0;
  vector<int,_std::allocator<int>_> local_98;
  code *local_80;
  undefined8 local_78;
  code *local_70;
  undefined8 local_68;
  code *local_60;
  undefined8 local_58;
  code *local_50;
  undefined8 local_48;
  byte local_39;
  vector<int,_std::allocator<int>_> *pvStack_38;
  bool hasEPT_local;
  vector<int,_std::allocator<int>_> *fileIDs_agg_local;
  vector<int,_std::allocator<int>_> *fileIDs_occ_local;
  vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
  *pvStack_20;
  int samplesize_local;
  vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
  *out_loss_local;
  set<int,_std::less<int>,_std::allocator<int>_> *summaryids_local;
  aggreports *agg_local;
  
  local_39 = hasEPT;
  pvStack_38 = fileIDs_agg;
  fileIDs_agg_local = fileIDs_occ;
  fileIDs_occ_local._4_4_ = samplesize;
  pvStack_20 = out_loss;
  out_loss_local =
       (vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
        *)summaryids;
  summaryids_local = (set<int,_std::less<int>,_std::allocator<int>_> *)agg;
  aggreports::SetInputData(agg,summaryids,out_loss);
  if ((local_39 & 1) != 0) {
    local_50 = OutLosses::GetMaxOutLoss;
    local_48 = 0;
    aggreports::OutputMeanDamageRatio
              ((aggreports *)summaryids_local,1,2,0x109b50,(vector<int,_std::allocator<int>_> *)0x0)
    ;
    local_60 = OutLosses::GetAggOutLoss;
    local_58 = 0;
    aggreports::OutputMeanDamageRatio
              ((aggreports *)summaryids_local,3,4,0x109b70,(vector<int,_std::allocator<int>_> *)0x0)
    ;
  }
  local_70 = OutLosses::GetMaxOutLoss;
  local_68 = 0;
  aggreports::OutputFullUncertainty((aggreports *)summaryids_local,4,1,2,0x109b50);
  local_80 = OutLosses::GetAggOutLoss;
  local_78 = 0;
  aggreports::OutputFullUncertainty((aggreports *)summaryids_local,0,3,4,0x109b70);
  psVar1 = summaryids_local;
  local_b0[0] = 5;
  local_b0[1] = 7;
  local_a8 = local_b0;
  local_a0 = 2;
  std::allocator<int>::allocator(&local_b1);
  __l_00._M_len = local_a0;
  __l_00._M_array = local_a8;
  std::vector<int,_std::allocator<int>_>::vector(&local_98,__l_00,&local_b1);
  local_d8 = OutLosses::GetMaxOutLoss;
  local_d0 = 0;
  aggreports::OutputWheatsheafAndWheatsheafMean((aggreports *)psVar1,&local_98,1,2,0x109b50);
  std::vector<int,_std::allocator<int>_>::~vector(&local_98);
  std::allocator<int>::~allocator(&local_b1);
  psVar1 = summaryids_local;
  local_108[0] = 1;
  local_108[1] = 3;
  local_100 = local_108;
  local_f8 = 2;
  std::allocator<int>::allocator(&local_109);
  __l._M_len = local_f8;
  __l._M_array = local_100;
  std::vector<int,_std::allocator<int>_>::vector(&local_f0,__l,&local_109);
  aggreports::OutputWheatsheafAndWheatsheafMean((aggreports *)psVar1,&local_f0,3,4,0x109b70);
  std::vector<int,_std::allocator<int>_>::~vector(&local_f0);
  std::allocator<int>::~allocator(&local_109);
  aggreports::OutputSampleMean((aggreports *)summaryids_local,6,1,2,0x109b50);
  aggreports::OutputSampleMean((aggreports *)summaryids_local,2,3,4,0x109b70);
  return;
}

Assistant:

inline void outputaggreports(aggreports &agg,
		const std::set<int> &summaryids,
		std::vector<std::map<outkey2, OutLosses>> &out_loss,
		const int samplesize, const std::vector<int> &fileIDs_occ,
		const std::vector<int> &fileIDs_agg, const bool hasEPT)
	{
		agg.SetInputData(summaryids, out_loss);
		if (hasEPT) {
			agg.OutputMeanDamageRatio(OEP, OEPTVAR,
						  &OutLosses::GetMaxOutLoss,
						  fileIDs_occ);
			agg.OutputMeanDamageRatio(AEP, AEPTVAR,
						  &OutLosses::GetAggOutLoss,
						  fileIDs_agg);
		}
		agg.OutputFullUncertainty(OCC_FULL_UNCERTAINTY, OEP, OEPTVAR,
					  &OutLosses::GetMaxOutLoss);
		agg.OutputFullUncertainty(AGG_FULL_UNCERTAINTY, AEP, AEPTVAR,
					  &OutLosses::GetAggOutLoss);
		agg.OutputWheatsheafAndWheatsheafMean({ OCC_WHEATSHEAF,
							OCC_WHEATSHEAF_MEAN },
						      OEP, OEPTVAR,
						      &OutLosses::GetMaxOutLoss);
		agg.OutputWheatsheafAndWheatsheafMean({ AGG_WHEATSHEAF,
							AGG_WHEATSHEAF_MEAN },
						      AEP, AEPTVAR,
						      &OutLosses::GetAggOutLoss);
		agg.OutputSampleMean(OCC_SAMPLE_MEAN, OEP, OEPTVAR,
				     &OutLosses::GetMaxOutLoss);
		agg.OutputSampleMean(AGG_SAMPLE_MEAN, AEP, AEPTVAR,
				     &OutLosses::GetAggOutLoss);
	}